

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O2

void __thiscall rtosc::Port_Matcher::~Port_Matcher(Port_Matcher *this)

{
  if (this->m_enump != (bool *)0x0) {
    operator_delete__(this->m_enump);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->remap).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->assoc).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->pos).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&(this->arg_spec).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->fixed);
  return;
}

Assistant:

~Port_Matcher() { delete[] m_enump; }